

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

bool __thiscall ON_ClippingPlane::Write(ON_ClippingPlane *this,ON_BinaryArchive *file)

{
  ON_UuidList *pOVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ON_UUID *pOVar6;
  ON_ClippingPlaneData *pOVar7;
  long lVar8;
  ulong uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ON_UUID model_component_id;
  ON_UUID viewport_id;
  ON_UUID local_48;
  
  bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,5);
  if (!bVar2) {
    return false;
  }
  local_48.Data1 = 0;
  local_48.Data2 = 0;
  local_48.Data3 = 0;
  local_48.Data4[0] = '\0';
  local_48.Data4[1] = '\0';
  local_48.Data4[2] = '\0';
  local_48.Data4[3] = '\0';
  local_48.Data4[4] = '\0';
  local_48.Data4[5] = '\0';
  local_48.Data4[6] = '\0';
  local_48.Data4[7] = '\0';
  pOVar1 = &this->m_viewport_ids;
  iVar4 = ON_UuidList::Count(pOVar1);
  if (0 < iVar4) {
    pOVar6 = ON_UuidList::Array(pOVar1);
    local_48.Data1 = pOVar6->Data1;
    local_48.Data2 = pOVar6->Data2;
    local_48.Data3 = pOVar6->Data3;
    local_48.Data4 = *&pOVar6->Data4;
  }
  bVar2 = ON_BinaryArchive::WriteUuid(file,&local_48);
  if ((((bVar2) && (bVar2 = ON_BinaryArchive::WriteUuid(file,&this->m_plane_id), bVar2)) &&
      (bVar2 = ON_BinaryArchive::WritePlane(file,&this->m_plane), bVar2)) &&
     ((bVar2 = ON_BinaryArchive::WriteBool(file,this->m_bEnabled), bVar2 &&
      (bVar2 = ON_UuidList::Write(pOVar1,file), bVar2)))) {
    pOVar7 = GetClippingPlaneData((this->m_data_store).m_sn);
    if (pOVar7 == (ON_ClippingPlaneData *)0x0) {
      uVar10 = 0;
      uVar11 = 0;
    }
    else {
      uVar10 = SUB84(pOVar7->m_depth,0);
      uVar11 = (undefined4)((ulong)pOVar7->m_depth >> 0x20);
    }
    bVar2 = ON_BinaryArchive::WriteDouble(file,(double)CONCAT44(uVar11,uVar10));
    if ((bVar2) && (bVar2 = ON_BinaryArchive::WriteBool(file,this->m_depth_enabled), bVar2)) {
      pOVar7 = GetClippingPlaneData((this->m_data_store).m_sn);
      if (pOVar7 == (ON_ClippingPlaneData *)0x0) {
LAB_0056d089:
        if ((this->m_participation_lists_enabled != true) ||
           ((bVar2 = ON_BinaryArchive::WriteChar(file,'\r'), bVar2 &&
            (bVar2 = ON_BinaryArchive::WriteBool(file,this->m_participation_lists_enabled), bVar2)))
           ) {
          bVar2 = ON_BinaryArchive::WriteChar(file,'\0');
          goto LAB_0056d0ea;
        }
      }
      else {
        pOVar1 = &pOVar7->m_object_id_list;
        iVar4 = ON_UuidList::Count(pOVar1);
        if ((iVar4 < 1) || (pOVar6 = ON_UuidList::Array(pOVar1), pOVar6 == (ON_UUID *)0x0)) {
LAB_0056d026:
          if ((pOVar7->m_layer_list).m_count < 1) {
LAB_0056d082:
            if ((pOVar7->m_is_exclusion_list != false) ||
               ((bVar2 = ON_BinaryArchive::WriteChar(file,'\f'), bVar2 &&
                (bVar2 = ON_BinaryArchive::WriteBool(file,pOVar7->m_is_exclusion_list), bVar2))))
            goto LAB_0056d089;
          }
          else {
            bVar2 = ON_BinaryArchive::WriteChar(file,'\v');
            if (bVar2) {
              uVar5 = (pOVar7->m_layer_list).m_count;
              bVar2 = ON_BinaryArchive::WriteInt(file,uVar5);
              if (bVar2) {
                if (0 < (int)uVar5) {
                  uVar9 = 0;
                  do {
                    bVar2 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                                      (file,Layer,(pOVar7->m_layer_list).m_a[uVar9]);
                    if (!bVar2) goto LAB_0056d0e8;
                    uVar9 = uVar9 + 1;
                  } while (uVar5 != uVar9);
                }
                goto LAB_0056d082;
              }
            }
          }
        }
        else {
          bVar2 = ON_BinaryArchive::WriteChar(file,'\n');
          if (bVar2) {
            uVar5 = ON_UuidList::Count(pOVar1);
            bVar2 = ON_BinaryArchive::WriteInt(file,uVar5);
            if (bVar2) {
              if (0 < (int)uVar5) {
                lVar8 = 0;
                do {
                  model_component_id.Data4 = *(uchar (*) [8])(pOVar6->Data4 + lVar8);
                  model_component_id._0_8_ = *(undefined8 *)(pOVar6->Data4 + lVar8 + -8);
                  bVar2 = ON_BinaryArchive::Write3dmReferencedComponentId
                                    (file,ModelGeometry,model_component_id);
                  if (!bVar2) goto LAB_0056d0e8;
                  lVar8 = lVar8 + 0x10;
                } while ((ulong)uVar5 << 4 != lVar8);
              }
              goto LAB_0056d026;
            }
          }
        }
      }
    }
  }
LAB_0056d0e8:
  bVar2 = false;
LAB_0056d0ea:
  bVar3 = ON_BinaryArchive::EndWrite3dmChunk(file);
  return (bool)(bVar3 & bVar2);
}

Assistant:

bool ON_ClippingPlane::Write( ON_BinaryArchive& file ) const
{
  // 20 May 2023 S. Baer (RH-74763)
  // version 1.5 - write clip participation
  bool rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,5);
  if (!rc)
    return false;

  for(;;)
  {
    //version 1.1 - write list of viewport uuids instead of single uuid
    ON_UUID viewport_id = ::ON_nil_uuid;
    if( m_viewport_ids.Count() > 0 )
      viewport_id = *(m_viewport_ids.Array());
    rc = file.WriteUuid(viewport_id);
    if (!rc) break;

    rc = file.WriteUuid(m_plane_id);
    if (!rc) break;

    rc = file.WritePlane(m_plane);
    if (!rc) break;

    rc = file.WriteBool(m_bEnabled);
    if (!rc) break;

    //version 1.1 - write list of viewport uuids instead of single uuid
    rc = m_viewport_ids.Write(file);
    if (!rc) break;

    //version 1.2 - write distance as double
    //version 1.3 - continue to write distance, but the reader now knows to
    //              interpret the distance value in a different way
    double depth = Depth();
    rc = file.WriteDouble(depth);
    if (!rc) break;

    //version 1.4 - write enabled flag for depth
    rc = file.WriteBool(m_depth_enabled);
    if (!rc) break;

    //version 1.5
    ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store.m_sn);

    if (data && data->m_object_id_list.Count() > 0)
    {
      const ON_UUID* ids = data->m_object_id_list.Array();
      if (ids)
      {
        unsigned char c = ON_ClippingPlaneTypeCodes::ClipParticipationObjectList; // 10
        rc = file.WriteChar(c);
        if (!rc) break;

        int count = data->m_object_id_list.Count();
        rc = file.WriteInt(count);
        if (!rc) break;

        for (int i = 0; i < count; i++)
        {
          rc = file.Write3dmReferencedComponentId(ON_ModelComponent::Type::ModelGeometry, ids[i]);
          if (!rc) break;
        }
        if (!rc) break;
      }
    }
    if (data && data->m_layer_list.Count() > 0)
    {
      unsigned char c = ON_ClippingPlaneTypeCodes::ClipParticipationLayerList; // 11
      rc = file.WriteChar(c);
      if (!rc) break;

      int count = data->m_layer_list.Count();
      rc = file.WriteInt(count);
      if (!rc) break;
      for (int i = 0; i < count; i++)
      {
        int layer_index = data->m_layer_list[i];
        rc = file.Write3dmReferencedComponentIndex(ON_ModelComponent::Type::Layer, layer_index);
        if (!rc) break;
      }
      if (!rc) break;
    }
    if (data && data->m_is_exclusion_list == false)
    {
      unsigned char c = ON_ClippingPlaneTypeCodes::ClipParticipationIsExclusion; // 12
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteBool(data->m_is_exclusion_list);
      if (!rc) break;
    }
    if (m_participation_lists_enabled)
    {
      unsigned char c = ON_ClippingPlaneTypeCodes::ClipParticipationEnabled; // 13
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteBool(m_participation_lists_enabled);
      if (!rc) break;
    }

    unsigned char lastTypeCode = 0;
    rc = file.WriteChar(lastTypeCode);
    break;
  }

  if ( !file.EndWrite3dmChunk() )
    rc = false;

  return rc;
}